

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGNextValue(xmlRelaxNGValidCtxtPtr ctxt)

{
  bool bVar1;
  xmlChar *local_20;
  xmlChar *cur;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  local_20 = ctxt->state->value;
  if ((local_20 == (xmlChar *)0x0) || (ctxt->state->endvalue == (xmlChar *)0x0)) {
    ctxt->state->value = (xmlChar *)0x0;
    ctxt->state->endvalue = (xmlChar *)0x0;
  }
  else {
    for (; *local_20 != '\0'; local_20 = local_20 + 1) {
    }
    while( true ) {
      bVar1 = false;
      if (local_20 != ctxt->state->endvalue) {
        bVar1 = *local_20 == '\0';
      }
      if (!bVar1) break;
      local_20 = local_20 + 1;
    }
    if (local_20 == ctxt->state->endvalue) {
      ctxt->state->value = (xmlChar *)0x0;
    }
    else {
      ctxt->state->value = local_20;
    }
  }
  return 0;
}

Assistant:

static int
xmlRelaxNGNextValue(xmlRelaxNGValidCtxtPtr ctxt)
{
    xmlChar *cur;

    cur = ctxt->state->value;
    if ((cur == NULL) || (ctxt->state->endvalue == NULL)) {
        ctxt->state->value = NULL;
        ctxt->state->endvalue = NULL;
        return (0);
    }
    while (*cur != 0)
        cur++;
    while ((cur != ctxt->state->endvalue) && (*cur == 0))
        cur++;
    if (cur == ctxt->state->endvalue)
        ctxt->state->value = NULL;
    else
        ctxt->state->value = cur;
    return (0);
}